

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDLoad * __thiscall
wasm::Builder::makeSIMDLoad
          (Builder *this,SIMDLoadOp op,Address offset,Address align,Expression *ptr,Name memory)

{
  SIMDLoad *pSVar1;
  
  pSVar1 = MixedArena::alloc<wasm::SIMDLoad>(&this->wasm->allocator);
  pSVar1->op = op;
  (pSVar1->offset).addr = offset.addr;
  (pSVar1->align).addr = align.addr;
  pSVar1->ptr = ptr;
  (pSVar1->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (pSVar1->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  wasm::SIMDLoad::finalize();
  return pSVar1;
}

Assistant:

SIMDLoad* makeSIMDLoad(SIMDLoadOp op,
                         Address offset,
                         Address align,
                         Expression* ptr,
                         Name memory) {
    auto* ret = wasm.allocator.alloc<SIMDLoad>();
    ret->op = op;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }